

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-twice.c
# Opt level: O0

void shutdown_cb(uv_shutdown_t *req,int status)

{
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_tcp_t *tcp;
  int status_local;
  uv_shutdown_t *req_local;
  
  if (req != &shutdown_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x44,"req","==","&shutdown_req",req,"==",&shutdown_req);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x45,"status","==","0",(long)status,"==",0);
    abort();
  }
  if ((shutdown_req.handle)->write_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x4a,"tcp->write_queue_size","==","0",(shutdown_req.handle)->write_queue_size,"==",0);
    abort();
  }
  shutdown_cb_called = shutdown_cb_called + 1;
  if ((long)write_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x50,"write_cb_called","==","3",(long)write_cb_called,"==",3);
    abort();
  }
  return;
}

Assistant:

static void shutdown_cb(uv_shutdown_t* req, int status) {
  ASSERT_PTR_EQ(req, &req1);
  ASSERT_OK(status);
  shutdown_cb_called++;
  uv_close((uv_handle_t*) req->handle, close_cb);
}